

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O2

aiColor4D __thiscall Assimp::M3DImporter::mkColor(M3DImporter *this,uint32_t c)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  aiColor4D aVar4;
  
  auVar2._0_4_ = (float)(c & 0xff);
  auVar2._4_4_ = (float)(c >> 8 & 0xff);
  auVar2._8_4_ = (float)(c >> 0x10 & 0xff);
  auVar2._12_4_ = (float)(c >> 0x18);
  auVar2 = divps(auVar2,_DAT_005d5c70);
  auVar1._4_8_ = SUB168(ZEXT1216((undefined1  [12])0x0),4);
  auVar1._0_4_ = auVar2._4_4_;
  auVar3._0_8_ = auVar1._0_8_ << 0x20;
  auVar3._8_4_ = auVar2._8_4_;
  auVar3._12_4_ = auVar2._12_4_;
  aVar4._0_8_ = auVar2._0_8_;
  aVar4.b = (float)(int)auVar3._8_8_;
  aVar4.a = (float)(int)((ulong)auVar3._8_8_ >> 0x20);
  return aVar4;
}

Assistant:

aiColor4D M3DImporter::mkColor(uint32_t c) {
	aiColor4D color;
	color.a = ((float)((c >> 24) & 0xff)) / 255;
	color.b = ((float)((c >> 16) & 0xff)) / 255;
	color.g = ((float)((c >> 8) & 0xff)) / 255;
	color.r = ((float)((c >> 0) & 0xff)) / 255;
	return color;
}